

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

sexp_conflict
sexp_load_standard_repl_env
          (sexp_conflict ctx,sexp_conflict env,sexp_conflict k,int bootp,int nonblocking)

{
  sexp_conflict e;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict local_40;
  sexp_gc_var_t local_38;
  
  local_38.var = &local_40;
  local_40 = (sexp_conflict)0x43e;
  local_38.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_38;
  local_40 = (sexp_conflict)sexp_load_standard_env();
  if ((((ulong)local_40 & 3) != 0) || (local_40->tag != 0x13)) {
    if (bootp == 0) {
      local_40 = (sexp_conflict)
                 sexp_eval_string(ctx,"(mutable-environment \'(scheme small))",0xffffffffffffffff,
                                  (((ctx->value).type.setters)->value).opcode.func);
    }
    if ((((ulong)local_40 & 3) != 0) || (local_40->tag != 0x13)) {
      sexp_add_import_binding(ctx,local_40);
    }
    if ((((ulong)local_40 & 3) != 0) || (local_40->tag != 0x13)) {
      local_40 = sexp_load_standard_params(ctx,local_40,nonblocking);
    }
  }
  (ctx->value).context.saves = local_38.next;
  return local_40;
}

Assistant:

static sexp sexp_load_standard_repl_env (sexp ctx, sexp env, sexp k, int bootp, int nonblocking) {
  sexp_gc_var1(e);
  sexp_gc_preserve1(ctx, e);
  e = sexp_load_standard_env(ctx, env, k);
  if (!sexp_exceptionp(e)) {
#if SEXP_USE_MODULES
    if (!bootp)
      e = sexp_eval_string(ctx, sexp_default_environment, -1, sexp_global(ctx, SEXP_G_META_ENV));
    if (!sexp_exceptionp(e))
      sexp_add_import_binding(ctx, e);
#endif
    if (!sexp_exceptionp(e))
      e = sexp_load_standard_params(ctx, e, nonblocking);
  }
  sexp_gc_release1(ctx);
  return e;
}